

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fFboApiTests.cpp
# Opt level: O0

void deqp::gles3::Functional::checkError(TestContext *testCtx,Context *ctx,GLenum expect)

{
  TestLog *this;
  MessageBuilder *pMVar1;
  Enum<int,_2UL> EVar2;
  char (*local_1e8) [5];
  Enum<int,_2UL> local_1c0 [2];
  MessageBuilder local_1a0;
  GLenum local_20;
  GLenum local_1c;
  GLenum result;
  GLenum expect_local;
  Context *ctx_local;
  TestContext *testCtx_local;
  
  local_1c = expect;
  _result = ctx;
  ctx_local = (Context *)testCtx;
  local_20 = (*ctx->_vptr_Context[0x79])();
  this = tcu::TestContext::getLog((TestContext *)ctx_local);
  tcu::TestLog::operator<<(&local_1a0,this,(BeginMessageToken *)&tcu::TestLog::Message);
  pMVar1 = tcu::MessageBuilder::operator<<(&local_1a0,(char (*) [4])0x2bf72b7);
  if (local_20 == local_1c) {
    local_1e8 = (char (*) [5])0x2b44323;
  }
  else {
    local_1e8 = (char (*) [5])0x2c0b9be;
  }
  pMVar1 = tcu::MessageBuilder::operator<<(pMVar1,local_1e8);
  pMVar1 = tcu::MessageBuilder::operator<<(pMVar1,(char (*) [12])0x2c16365);
  EVar2 = glu::getErrorStr(local_1c);
  local_1c0[0].m_getName = EVar2.m_getName;
  local_1c0[0].m_value = EVar2.m_value;
  pMVar1 = tcu::MessageBuilder::operator<<(pMVar1,local_1c0);
  tcu::MessageBuilder::operator<<(pMVar1,(EndMessageToken *)&tcu::TestLog::EndMessage);
  tcu::MessageBuilder::~MessageBuilder(&local_1a0);
  if (local_20 != local_1c) {
    tcu::TestContext::setTestResult
              ((TestContext *)ctx_local,QP_TEST_RESULT_FAIL,"Error code mismatch");
  }
  return;
}

Assistant:

static void checkError (tcu::TestContext& testCtx, sglr::Context& ctx, GLenum expect)
{
	GLenum result = ctx.getError();
	testCtx.getLog() << TestLog::Message << "// " << (result == expect ? "Pass" : "Fail") << ", expected " << glu::getErrorStr(expect) << TestLog::EndMessage;

	if (result != expect)
		testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Error code mismatch");
}